

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransformerType::~IfcTransformerType(IfcTransformerType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcEnergyConversionDeviceType).
                              super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject + -0x18)
  ;
  this_00 = (IfcTypeProduct *)
            ((long)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType
                    .super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1d0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1d0) = 0x88edd8;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x88ef40;
  *(undefined8 *)((long)pvVar1 + -0x148) = 0x88ee00;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x88ee28;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x88ee50;
  *(undefined8 *)((long)pvVar1 + -0x88) = 0x88ee78;
  *(undefined8 *)((long)pvVar1 + -0x50) = 0x88eea0;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x88eec8;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x88eef0;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x88ef18;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x88f568;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x80 = 0x88f630;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x88f590;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x88f5b8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x88f5e0;
  *(undefined8 *)&this_00->field_0x148 = 0x88f608;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__0088ef78);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTransformerType() : Object("IfcTransformerType") {}